

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O3

void sycc422_to_rgb(opj_image_t *img)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OPJ_UINT32 OVar5;
  opj_image_comp_t *poVar6;
  int *__ptr;
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  uint *__ptr_00;
  uint *__ptr_01;
  uint *__ptr_02;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int *piVar16;
  uint uVar17;
  uint *puVar18;
  uint *puVar19;
  uint *puVar20;
  int *piVar21;
  ulong uVar22;
  int *piVar23;
  size_t __size;
  ulong uVar24;
  double dVar25;
  uint uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  
  poVar6 = img->comps;
  bVar1 = (byte)poVar6->prec;
  iVar15 = 1 << (bVar1 - 1 & 0x1f);
  uVar11 = poVar6->w;
  uVar22 = (ulong)poVar6->h;
  __ptr = poVar6->data;
  piVar23 = poVar6[1].data;
  piVar16 = poVar6[2].data;
  __size = uVar11 * uVar22 * 4;
  __ptr_00 = (uint *)malloc(__size);
  __ptr_01 = (uint *)malloc(__size);
  __ptr_02 = (uint *)malloc(__size);
  if (__ptr_02 != (uint *)0x0 && (__ptr_01 != (uint *)0x0 && __ptr_00 != (uint *)0x0)) {
    if (uVar22 != 0) {
      uVar14 = ~(-1 << (bVar1 & 0x1f));
      uVar17 = img->x0 & 1;
      dVar25 = (double)-iVar15;
      uVar12 = (ulong)uVar11 - (ulong)uVar17;
      uVar13 = uVar12 & 0xfffffffffffffffe;
      uVar10 = 0;
      puVar18 = __ptr_00;
      puVar19 = __ptr_01;
      puVar20 = __ptr_02;
      piVar21 = __ptr;
      do {
        if (uVar17 != 0) {
          iVar2 = *piVar21;
          uVar8 = iVar2 - (int)(dVar25 * 0.344 + dVar25 * 0.714);
          uVar11 = uVar14;
          if ((int)uVar8 < (int)uVar14) {
            uVar11 = uVar8;
          }
          if ((int)uVar8 < 0) {
            uVar11 = 0;
          }
          *puVar19 = uVar11;
          uVar26 = iVar2 + (int)(dVar25 * 1.772);
          uVar27 = iVar2 + (int)(dVar25 * 1.402);
          uVar8 = uVar27;
          if ((int)uVar14 <= (int)uVar27) {
            uVar8 = uVar14;
          }
          auVar28._4_4_ = uVar26;
          auVar28._0_4_ = uVar26;
          auVar28._8_4_ = uVar27;
          auVar28._12_4_ = uVar27;
          uVar11 = movmskpd(uVar11,auVar28);
          if ((uVar11 & 2) != 0) {
            uVar8 = 0;
          }
          *puVar18 = uVar8;
          if ((int)uVar14 <= (int)uVar26) {
            uVar26 = uVar14;
          }
          if ((uVar11 & 1) != 0) {
            uVar26 = 0;
          }
          *puVar20 = uVar26;
          piVar21 = piVar21 + 1;
          puVar18 = puVar18 + 1;
          puVar19 = puVar19 + 1;
          puVar20 = puVar20 + 1;
        }
        if (uVar13 == 0) {
          uVar24 = 0;
        }
        else {
          uVar24 = 0;
          do {
            iVar2 = *piVar16;
            iVar3 = *piVar21;
            uVar8 = (int)((double)(iVar2 - iVar15) * 1.402) + iVar3;
            uVar11 = uVar8;
            if ((int)uVar14 <= (int)uVar8) {
              uVar11 = uVar14;
            }
            uVar26 = 0;
            if (-1 < (int)uVar8) {
              uVar26 = uVar11;
            }
            iVar4 = *piVar23;
            *puVar18 = uVar26;
            uVar8 = iVar3 - (int)((double)(iVar4 - iVar15) * 0.344 +
                                 (double)(iVar2 - iVar15) * 0.714);
            uVar11 = uVar8;
            if ((int)uVar14 <= (int)uVar8) {
              uVar11 = uVar14;
            }
            uVar26 = 0;
            if (-1 < (int)uVar8) {
              uVar26 = uVar11;
            }
            *puVar19 = uVar26;
            uVar8 = iVar3 + (int)((double)(iVar4 - iVar15) * 1.772);
            uVar11 = uVar8;
            if ((int)uVar14 <= (int)uVar8) {
              uVar11 = uVar14;
            }
            uVar26 = 0;
            if (-1 < (int)uVar8) {
              uVar26 = uVar11;
            }
            *puVar20 = uVar26;
            iVar2 = piVar21[1];
            iVar3 = *piVar16;
            iVar4 = *piVar23;
            uVar8 = (int)((double)(iVar3 - iVar15) * 1.402) + iVar2;
            uVar11 = uVar8;
            if ((int)uVar14 <= (int)uVar8) {
              uVar11 = uVar14;
            }
            uVar26 = 0;
            if (-1 < (int)uVar8) {
              uVar26 = uVar11;
            }
            puVar18[1] = uVar26;
            uVar8 = iVar2 - (int)((double)(iVar4 - iVar15) * 0.344 +
                                 (double)(iVar3 - iVar15) * 0.714);
            uVar11 = uVar8;
            if ((int)uVar14 <= (int)uVar8) {
              uVar11 = uVar14;
            }
            uVar26 = 0;
            if (-1 < (int)uVar8) {
              uVar26 = uVar11;
            }
            puVar19[1] = uVar26;
            uVar8 = iVar2 + (int)((double)(iVar4 - iVar15) * 1.772);
            uVar11 = uVar8;
            if ((int)uVar14 <= (int)uVar8) {
              uVar11 = uVar14;
            }
            uVar26 = 0;
            if (-1 < (int)uVar8) {
              uVar26 = uVar11;
            }
            puVar20[1] = uVar26;
            piVar21 = piVar21 + 2;
            puVar18 = puVar18 + 2;
            puVar19 = puVar19 + 2;
            puVar20 = puVar20 + 2;
            piVar23 = piVar23 + 1;
            piVar16 = piVar16 + 1;
            uVar24 = uVar24 + 2;
          } while (uVar24 < uVar13);
        }
        if (uVar24 < uVar12) {
          iVar2 = *piVar21;
          uVar8 = iVar2 + (int)((double)(*piVar23 - iVar15) * 1.772);
          uVar26 = iVar2 + (int)((double)(*piVar16 - iVar15) * 1.402);
          uVar11 = uVar26;
          if ((int)uVar14 <= (int)uVar26) {
            uVar11 = uVar14;
          }
          auVar7._4_4_ = uVar8;
          auVar7._0_4_ = uVar8;
          auVar7._8_4_ = uVar26;
          auVar7._12_4_ = uVar26;
          uVar26 = movmskpd((int)uVar24,auVar7);
          if ((uVar26 & 2) != 0) {
            uVar11 = 0;
          }
          uVar9 = iVar2 - (int)((double)(*piVar23 - iVar15) * 0.344 +
                               (double)(*piVar16 - iVar15) * 0.714);
          uVar27 = uVar14;
          if ((int)uVar9 < (int)uVar14) {
            uVar27 = uVar9;
          }
          if ((int)uVar9 < 0) {
            uVar27 = 0;
          }
          if ((int)uVar14 <= (int)uVar8) {
            uVar8 = uVar14;
          }
          *puVar18 = uVar11;
          if ((uVar26 & 1) != 0) {
            uVar8 = 0;
          }
          *puVar19 = uVar27;
          *puVar20 = uVar8;
          piVar21 = piVar21 + 1;
          puVar18 = puVar18 + 1;
          puVar19 = puVar19 + 1;
          puVar20 = puVar20 + 1;
          piVar23 = piVar23 + 1;
          piVar16 = piVar16 + 1;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar22);
    }
    free(__ptr);
    poVar6 = img->comps;
    poVar6->data = (OPJ_INT32 *)__ptr_00;
    free(poVar6[1].data);
    poVar6 = img->comps;
    poVar6[1].data = (OPJ_INT32 *)__ptr_01;
    free(poVar6[2].data);
    poVar6 = img->comps;
    poVar6[2].data = (OPJ_INT32 *)__ptr_02;
    poVar6[2].w = poVar6->w;
    poVar6[1].w = poVar6->w;
    poVar6[2].h = poVar6->h;
    poVar6[1].h = poVar6->h;
    OVar5 = poVar6->dy;
    poVar6[2].dx = poVar6->dx;
    poVar6[1].dx = poVar6->dx;
    poVar6[2].dy = OVar5;
    poVar6[1].dy = OVar5;
    img->color_space = OPJ_CLRSPC_SRGB;
    return;
  }
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  return;
}

Assistant:

static void sycc422_to_rgb(opj_image_t *img)
{	
	int *d0, *d1, *d2, *r, *g, *b;
	const int *y, *cb, *cr;
	size_t maxw, maxh, max, offx, loopmaxw;
	int offset, upb;
	size_t i;

	upb = (int)img->comps[0].prec;
	offset = 1<<(upb - 1); upb = (1<<upb)-1;

	maxw = (size_t)img->comps[0].w; maxh = (size_t)img->comps[0].h;
	max = maxw * maxh;

	y = img->comps[0].data;
	cb = img->comps[1].data;
	cr = img->comps[2].data;

	d0 = r = (int*)malloc(sizeof(int) * max);
	d1 = g = (int*)malloc(sizeof(int) * max);
	d2 = b = (int*)malloc(sizeof(int) * max);

	if(r == NULL || g == NULL || b == NULL) goto fails;

	/* if img->x0 is odd, then first column shall use Cb/Cr = 0 */
	offx = img->x0 & 1U;
	loopmaxw = maxw - offx;
	
	for(i=0U; i < maxh; ++i)
	{
		size_t j;
		
		if (offx > 0U) {
			sycc_to_rgb(offset, upb, *y, 0, 0, r, g, b);
			++y; ++r; ++g; ++b;
		}
		
		for(j=0U; j < (loopmaxw & ~(size_t)1U); j += 2U)
		{
			sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
			++y; ++r; ++g; ++b;
			sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
			++y; ++r; ++g; ++b; ++cb; ++cr;
		}
		if (j < loopmaxw) {
			sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
			++y; ++r; ++g; ++b; ++cb; ++cr;
		}
	}
	
	free(img->comps[0].data); img->comps[0].data = d0;
	free(img->comps[1].data); img->comps[1].data = d1;
	free(img->comps[2].data); img->comps[2].data = d2;

	img->comps[1].w = img->comps[2].w = img->comps[0].w;
	img->comps[1].h = img->comps[2].h = img->comps[0].h;
	img->comps[1].dx = img->comps[2].dx = img->comps[0].dx;
	img->comps[1].dy = img->comps[2].dy = img->comps[0].dy;
	img->color_space = OPJ_CLRSPC_SRGB;
	return;

fails:
	free(r);
	free(g);
	free(b);
}